

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall
pbrt::StatsAccumulator::ReportPercentage
          (StatsAccumulator *this,char *name,int64_t num,int64_t denom)

{
  Stats *pSVar1;
  mapped_type *pmVar2;
  allocator<char> local_49;
  key_type local_48;
  
  pSVar1 = this->stats;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>_>_>_>
           ::operator[](&pSVar1->percentages,&local_48);
  pmVar2->first = pmVar2->first + num;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pSVar1 = this->stats;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<long,_long>_>_>_>
           ::operator[](&pSVar1->percentages,&local_48);
  pmVar2->second = pmVar2->second + denom;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StatsAccumulator::ReportPercentage(const char *name, int64_t num, int64_t denom) {
    stats->percentages[name].first += num;
    stats->percentages[name].second += denom;
}